

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>::iterator,_bool>
* __thiscall
phmap::priv::
raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,phmap::priv::(anonymous_namespace)::DecomposeHash,phmap::priv::(anonymous_namespace)::DecomposeEq,std::allocator<int>>
::emplace_decomposable<char_const*,char_const*const&>
          (pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,phmap::priv::(anonymous_namespace)::DecomposeHash,phmap::priv::(anonymous_namespace)::DecomposeEq,std::allocator<int>>
          *this,char **key,size_t hashval,char **args)

{
  size_t i;
  ctrl_t h;
  bool local_59;
  iterator local_58;
  bool local_41;
  iterator local_40;
  size_t local_30;
  size_t offset;
  char **args_local;
  size_t hashval_local;
  char **key_local;
  raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>
  *this_local;
  
  offset = (size_t)args;
  args_local = (char **)hashval;
  hashval_local = (size_t)key;
  key_local = (char **)this;
  local_30 = _find_key<char_const*>(this,key,hashval);
  if (local_30 == 0xffffffffffffffff) {
    local_30 = raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>
               ::prepare_insert((raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>
                                 *)this,(size_t)args_local);
    emplace_at<char_const*const&>(this,local_30,(char **)offset);
    i = local_30;
    h = H2((size_t)args_local);
    raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>
    ::set_ctrl((raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>
                *)this,i,h);
    local_40 = raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>
               ::iterator_at((raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>
                              *)this,local_30);
    local_41 = true;
    std::
    pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>::iterator,_bool>
    ::
    pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>::iterator,_bool,_true>
              (__return_storage_ptr__,&local_40,&local_41);
  }
  else {
    local_58 = raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>
               ::iterator_at((raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>
                              *)this,local_30);
    local_59 = false;
    std::
    pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>::iterator,_bool>
    ::
    pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::DecomposePolicy,_phmap::priv::(anonymous_namespace)::DecomposeHash,_phmap::priv::(anonymous_namespace)::DecomposeEq,_std::allocator<int>_>::iterator,_bool,_true>
              (__return_storage_ptr__,&local_58,&local_59);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> emplace_decomposable(const K& key, size_t hashval, 
                                                   Args&&... args)
    {
        size_t offset = _find_key(key, hashval);
        if (offset == (size_t)-1) {
            offset = prepare_insert(hashval);
            emplace_at(offset, std::forward<Args>(args)...);
            this->set_ctrl(offset, H2(hashval));
            return {iterator_at(offset), true};
        }
        return {iterator_at(offset), false};
    }